

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

void save_comp_rd_search_stat
               (MACROBLOCK *x,MB_MODE_INFO *mbmi,int32_t *comp_rate,int64_t *comp_dist,
               int32_t *comp_model_rate,int64_t *comp_model_dist,int_mv *cur_mv,int *comp_rs2)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  MB_MODE_INFO *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  WarpedMotionParams *wm;
  undefined8 *in_stack_00000008;
  int i;
  MACROBLOCKD *xd;
  COMP_RD_STATS *rd_stats;
  int offset;
  int local_4c;
  
  if (*(int *)(in_RDI + 0x1ee50) < 0x40) {
    puVar2 = (undefined8 *)(in_RDI + 0x1c650 + (long)*(int *)(in_RDI + 0x1ee50) * 0xa0);
    *puVar2 = *in_RDX;
    puVar2[1] = in_RDX[1];
    puVar2[2] = *in_RCX;
    puVar2[3] = in_RCX[1];
    puVar2[4] = in_RCX[2];
    puVar2[5] = in_RCX[3];
    puVar2[6] = *in_R8;
    puVar2[7] = in_R8[1];
    puVar2[8] = *in_R9;
    puVar2[9] = in_R9[1];
    puVar2[10] = in_R9[2];
    puVar2[0xb] = in_R9[3];
    puVar2[0xc] = *(undefined8 *)xd;
    puVar2[0xd] = *(undefined8 *)&xd->mi_stride;
    puVar2[0xe] = *in_stack_00000008;
    *(undefined2 *)(puVar2 + 0xf) = *(undefined2 *)in_RSI->ref_frame;
    *(PREDICTION_MODE *)((long)puVar2 + 0x7a) = in_RSI->mode;
    *(int_interpfilters *)((long)puVar2 + 0x7c) = in_RSI->interp_filters;
    *(uint *)(puVar2 + 0x10) = (uint)((byte)(*(ushort *)&in_RSI->field_0xa7 >> 4) & 3);
    for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
      iVar1 = is_global_mv_block(in_RSI,*(TransformationType *)
                                         (*(long *)(in_RDI + 0x2b98) +
                                          (long)in_RSI->ref_frame[local_4c] * 0x24 + 0x20));
      *(int *)((long)puVar2 + (long)local_4c * 4 + 0x84) = iVar1;
    }
    puVar2[0x12] = (in_RSI->interinter_comp).seg_mask;
    puVar2[0x13] = *(undefined8 *)&(in_RSI->interinter_comp).wedge_index;
    *(int *)(in_RDI + 0x1ee50) = *(int *)(in_RDI + 0x1ee50) + 1;
  }
  return;
}

Assistant:

static inline void save_comp_rd_search_stat(
    MACROBLOCK *x, const MB_MODE_INFO *const mbmi, const int32_t *comp_rate,
    const int64_t *comp_dist, const int32_t *comp_model_rate,
    const int64_t *comp_model_dist, const int_mv *cur_mv, const int *comp_rs2) {
  const int offset = x->comp_rd_stats_idx;
  if (offset < MAX_COMP_RD_STATS) {
    COMP_RD_STATS *const rd_stats = x->comp_rd_stats + offset;
    memcpy(rd_stats->rate, comp_rate, sizeof(rd_stats->rate));
    memcpy(rd_stats->dist, comp_dist, sizeof(rd_stats->dist));
    memcpy(rd_stats->model_rate, comp_model_rate, sizeof(rd_stats->model_rate));
    memcpy(rd_stats->model_dist, comp_model_dist, sizeof(rd_stats->model_dist));
    memcpy(rd_stats->comp_rs2, comp_rs2, sizeof(rd_stats->comp_rs2));
    memcpy(rd_stats->mv, cur_mv, sizeof(rd_stats->mv));
    memcpy(rd_stats->ref_frames, mbmi->ref_frame, sizeof(rd_stats->ref_frames));
    rd_stats->mode = mbmi->mode;
    rd_stats->filter = mbmi->interp_filters;
    rd_stats->ref_mv_idx = mbmi->ref_mv_idx;
    const MACROBLOCKD *const xd = &x->e_mbd;
    for (int i = 0; i < 2; ++i) {
      const WarpedMotionParams *const wm =
          &xd->global_motion[mbmi->ref_frame[i]];
      rd_stats->is_global[i] = is_global_mv_block(mbmi, wm->wmtype);
    }
    memcpy(&rd_stats->interinter_comp, &mbmi->interinter_comp,
           sizeof(rd_stats->interinter_comp));
    ++x->comp_rd_stats_idx;
  }
}